

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<BLOCK_SIZE,_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long),_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
::~CartesianProductGenerator
          (CartesianProductGenerator<BLOCK_SIZE,_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long),_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
           *this)

{
  ParamGeneratorInterface<std::tuple<BLOCK_SIZE,_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long),_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
  *in_RDI;
  
  in_RDI->_vptr_ParamGeneratorInterface = (_func_int **)&PTR__CartesianProductGenerator_01fb8c50;
  std::
  tuple<testing::internal::ParamGenerator<BLOCK_SIZE>,_testing::internal::ParamGenerator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamGenerator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
  ::~tuple((tuple<testing::internal::ParamGenerator<BLOCK_SIZE>,_testing::internal::ParamGenerator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>,_testing::internal::ParamGenerator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
            *)0xc5e1aa);
  ParamGeneratorInterface<std::tuple<BLOCK_SIZE,_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long),_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>_>
  ::~ParamGeneratorInterface(in_RDI);
  return;
}

Assistant:

~CartesianProductGenerator() override {}